

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::LogFormat::updateDateFormat(LogFormat *this,size_t index,string_t *currFormat)

{
  undefined *puVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  string_t *psVar5;
  allocator local_209;
  string local_208 [32];
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [380];
  int local_2c;
  _Alloc_hider *p_Stack_28;
  int count;
  char_t *ptr;
  string_t *currFormat_local;
  size_t index_local;
  LogFormat *this_local;
  
  ptr = (char_t *)currFormat;
  currFormat_local = (string_t *)index;
  index_local = (size_t)this;
  bVar2 = hasFlag(this,DateTime);
  if (bVar2) {
    sVar3 = strlen(consts::kDateTimeFormatSpecifier);
    currFormat_local = (string_t *)(&currFormat_local->_M_dataplus + sVar3);
  }
  lVar4 = std::__cxx11::string::c_str();
  p_Stack_28 = &currFormat_local->_M_dataplus + lVar4;
  psVar5 = (string_t *)std::__cxx11::string::size();
  if ((currFormat_local < psVar5) && (*p_Stack_28 == (_Alloc_hider)0x7b)) {
    p_Stack_28 = p_Stack_28 + 1;
    local_2c = 1;
    std::__cxx11::stringstream::stringstream(local_1b8);
    for (; *p_Stack_28 != (_Alloc_hider)0x0; p_Stack_28 = p_Stack_28 + 1) {
      if (*p_Stack_28 == (_Alloc_hider)0x7d) {
        local_2c = local_2c + 1;
        break;
      }
      std::operator<<(local_1a8,(char)*p_Stack_28);
      local_2c = local_2c + 1;
    }
    std::__cxx11::string::erase((ulong)ptr,(ulong)currFormat_local);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&this->m_dateTimeFormat,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  else {
    bVar2 = hasFlag(this,DateTime);
    puVar1 = consts::kDefaultDateTimeFormat;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,puVar1,&local_209);
      std::__cxx11::string::operator=((string *)&this->m_dateTimeFormat,local_208);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
    }
  }
  return;
}

Assistant:

void LogFormat::updateDateFormat(std::size_t index, base::type::string_t& currFormat) {
  if (hasFlag(base::FormatFlags::DateTime)) {
    index += ELPP_STRLEN(base::consts::kDateTimeFormatSpecifier);
  }
  const base::type::char_t* ptr = currFormat.c_str() + index;
  if ((currFormat.size() > index) && (ptr[0] == '{')) {
    // User has provided format for date/time
    ++ptr;
    int count = 1;  // Start by 1 in order to remove starting brace
    std::stringstream ss;
    for (; *ptr; ++ptr, ++count) {
      if (*ptr == '}') {
        ++count;  // In order to remove ending brace
        break;
      }
      ss << static_cast<char>(*ptr);
    }
    currFormat.erase(index, count);
    m_dateTimeFormat = ss.str();
  } else {
    // No format provided, use default
    if (hasFlag(base::FormatFlags::DateTime)) {
      m_dateTimeFormat = std::string(base::consts::kDefaultDateTimeFormat);
    }
  }
}